

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,int *iRow,int *hint)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  ulong uVar11;
  vector<int,_std::allocator<int>_> *pvVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  vector<int,_std::allocator<int>_> *local_3d0;
  int local_3c4;
  vector<int,_std::allocator<int>_> *local_3c0;
  undefined8 uStack_3b8;
  vector<int,_std::allocator<int>_> *local_3b0 [2];
  value_type local_39c;
  value_type local_398;
  value_type local_38c;
  int local_388;
  int local_384;
  vector<double,_std::allocator<double>_> *local_380;
  reference local_378;
  reference local_370;
  vector<int,_std::allocator<int>_> *local_368;
  reference local_360;
  reference local_358;
  vector<int,_std::allocator<int>_> *local_350;
  vector<int,_std::allocator<int>_> *local_348;
  value_type local_33c;
  value_type local_338;
  vector<int,_std::allocator<int>_> *local_330;
  int local_328;
  int local_324;
  int local_320;
  value_type local_31c;
  value_type local_318;
  vector<int,_std::allocator<int>_> *local_310;
  int local_304;
  int local_300;
  int local_2fc;
  int *local_2f8;
  pair<int,_int> local_2f0;
  size_type local_2e8;
  size_type local_2e0;
  vector<int,_std::allocator<int>_> *local_2d8;
  vector<int,_std::allocator<int>_> *local_2d0;
  ulong local_2c8;
  value_type local_2c0;
  vector<double,_std::allocator<double>_> *local_2b8;
  double local_2b0;
  value_type local_2a8;
  double local_2a0;
  double local_298;
  value_type local_290;
  ulong local_288;
  value_type local_280;
  vector<double,_std::allocator<double>_> *local_278;
  double local_270;
  int local_264;
  value_type local_260;
  undefined8 *local_258;
  undefined4 *local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  HFactor *local_220;
  int local_218;
  int local_214;
  int local_210;
  int iPut;
  int iTo;
  int iEnd;
  int iFrom;
  int new_space;
  int new_start;
  int row_count;
  int row_start;
  int iLogic_3;
  int k_4;
  int UendX;
  int UstartX_1;
  int iLast_1;
  int iFind_1;
  int iLogic_2;
  int k_3;
  int iLast;
  int iFind;
  int iLogic_1;
  int k_2;
  int cLogic;
  int cIndex;
  int cp_2;
  pair<int,_int> *local_1b0;
  pair<int,_int> local_1a4;
  undefined4 local_19c;
  double local_198;
  double local_190;
  double value_7;
  int index_5;
  uint i_6;
  double pivotX;
  double value_6;
  int index_4;
  int k_1;
  double thex;
  value_type vStack_158;
  int k;
  double value_5;
  int kpivot;
  int pp_2;
  double value_4;
  int index_3;
  int i_5;
  double multiplier;
  int local_128;
  int pRow_1;
  int pp_1;
  int isort;
  double value_3;
  int index_2;
  int i_4;
  double value_2;
  int index_1;
  uint i_3;
  int UstartX;
  int UcountX;
  double ppaq;
  int i_2;
  int PFpp;
  double value_1;
  int local_d8;
  int pRow;
  int pp;
  value_type local_c8;
  double value;
  int local_b8;
  int index;
  int i_1;
  int cp_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  unsigned_long __vla_expr6;
  unsigned_long __vla_expr5;
  int iLogic;
  int cRow;
  int cp;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  int PFnp0;
  int i;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  HVector *local_40;
  HVector *vec;
  int numUpdate;
  int *hint_local;
  int *iRow_local;
  HVector *ep_local;
  HVector *aq_local;
  HFactor *this_local;
  
  vec._4_4_ = 0;
  for (local_40 = aq; local_40 != (HVector *)0x0; local_40 = local_40->next) {
    vec._4_4_ = vec._4_4_ + 1;
  }
  lVar9 = (long)&uStack_3d8 - ((ulong)vec._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  lVar8 = lVar9 - ((ulong)vec._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  __vla_expr2._4_4_ = 0;
  iRow_local = &ep->size;
  ep_local = aq;
  for (; __vla_expr2._4_4_ < (int)vec._4_4_; __vla_expr2._4_4_ = __vla_expr2._4_4_ + 1) {
    *(HVector **)(lVar9 + (long)__vla_expr2._4_4_ * 8) = ep_local;
    *(int **)(lVar8 + (long)__vla_expr2._4_4_ * 8) = iRow_local;
    ep_local = ep_local->next;
    iRow_local = *(int **)(iRow_local + 0x1e);
  }
  local_230 = lVar9;
  local_228 = lVar8;
  local_220 = this;
  *(undefined8 *)(lVar8 + -8) = 0x1642af;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->PFpivotIndex);
  local_248 = lVar8 - ((ulong)vec._4_4_ * 4 + 0xf & 0xfffffffffffffff0);
  local_240 = local_248 - ((ulong)vec._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  lVar9 = local_240 - ((ulong)vec._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  local_238 = lVar9;
  for (iLogic = 0; iLogic < (int)vec._4_4_; iLogic = iLogic + 1) {
    iVar2 = iRow[iLogic];
    pvVar12 = &local_220->UpivotLookup;
    *(undefined8 *)(lVar9 + -8) = 0x164353;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,(long)iVar2);
    iVar1 = *pvVar4;
    *(int *)(local_248 + (long)iLogic * 4) = iVar1;
    pvVar13 = &local_220->UpivotValue;
    *(undefined8 *)(lVar9 + -8) = 0x164383;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,(long)iVar1);
    *(value_type *)(local_240 + (long)iLogic * 8) = *pvVar5;
    lVar8 = *(long *)(local_230 + (long)iLogic * 8);
    *(undefined8 *)(lVar9 + -8) = 0x1643b6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(lVar8 + 0x20),(long)iVar2);
    *(value_type *)(local_238 + (long)iLogic * 8) = *pvVar5;
  }
  local_250 = (undefined4 *)(lVar9 - ((ulong)(vec._4_4_ + 1) * 4 + 0xf & 0xfffffffffffffff0));
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)vec._4_4_;
  puVar10 = (undefined8 *)
            ((long)local_250 -
            ((long)sorted_pp.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage * 8 + 0xfU & 0xfffffffffffffff0
            ));
  pvVar12 = &local_220->Uindex;
  local_258 = puVar10;
  puVar10[-1] = 0x16443c;
  sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
  *local_250 = (int)sVar6;
  puVar10[-1] = 0x164454;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)puVar10[-1]);
  for (index = 0; index < (int)vec._4_4_; index = index + 1) {
    puVar10[-1] = 0x16447d;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)puVar10[-1]);
    for (local_b8 = 0; local_b8 < *(int *)(*(long *)(local_230 + (long)index * 8) + 0x84);
        local_b8 = local_b8 + 1) {
      lVar9 = *(long *)(local_230 + (long)index * 8);
      sVar6 = (size_type)local_b8;
      puVar10[-1] = 0x1644d0;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(lVar9 + 0x88),sVar6);
      value._4_4_ = *pvVar4;
      lVar9 = *(long *)(local_230 + (long)index * 8);
      sVar6 = (size_type)local_b8;
      puVar10[-1] = 0x164500;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar9 + 0xa0),sVar6);
      local_c8 = *pvVar5;
      puVar10[-1] = 0x164523;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
      local_260 = local_c8;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value._4_4_;
      puVar10[-1] = 0x16454c;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      *pvVar5 = local_260;
    }
    for (local_d8 = 0; local_d8 < index; local_d8 = local_d8 + 1) {
      value_1._4_4_ = iRow[local_d8];
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_1._4_4_;
      puVar10[-1] = 0x1645d6;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      _i_2 = *pvVar5;
      ppaq._4_4_ = local_d8 + (int)sVar3;
      pvVar12 = &local_220->PFstart;
      sVar6 = (size_type)ppaq._4_4_;
      puVar10[-1] = 0x16460b;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar6);
      ppaq._0_4_ = *pvVar4;
      while( true ) {
        local_264 = ppaq._0_4_;
        pvVar12 = &local_220->PFstart;
        iVar2 = ppaq._4_4_ + 1;
        puVar10[-1] = 0x16463e;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,(long)iVar2);
        if (*pvVar4 <= local_264) break;
        local_278 = &local_220->dwork;
        pvVar12 = &local_220->PFindex;
        sVar6 = (size_type)ppaq._0_4_;
        puVar10[-1] = 0x164677;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar6);
        pvVar13 = local_278;
        iVar2 = *pvVar4;
        puVar10[-1] = 0x164686;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,(long)iVar2);
        local_270 = *pvVar5;
        pvVar13 = &local_220->PFvalue;
        sVar6 = (size_type)ppaq._0_4_;
        puVar10[-1] = 0x1646ac;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
        _i_2 = -local_270 * *pvVar5 + _i_2;
        ppaq._0_4_ = ppaq._0_4_ + 1;
      }
      puVar10[-1] = 0x164712;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
      local_280 = _i_2;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_1._4_4_;
      puVar10[-1] = 0x16473b;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      *pvVar5 = local_280;
    }
    pvVar13 = &local_220->dwork;
    iVar2 = iRow[index];
    puVar10[-1] = 0x16477a;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,(long)iVar2);
    _UstartX = *pvVar5;
    pvVar13 = &local_220->dwork;
    iVar2 = iRow[index];
    puVar10[-1] = 0x1647a5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,(long)iVar2);
    *pvVar5 = 0.0;
    index_1 = local_250[index];
    value_2._4_4_ = 0;
    i_3 = index_1;
    while( true ) {
      local_288 = (ulong)value_2._4_4_;
      pvVar12 = &local_220->iwork;
      puVar10[-1] = 0x1647f9;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
      if (sVar6 <= local_288) break;
      pvVar12 = &local_220->iwork;
      uVar11 = (ulong)value_2._4_4_;
      puVar10[-1] = 0x164824;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,uVar11);
      value_2._0_4_ = *pvVar4;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_2._0_4_;
      puVar10[-1] = 0x164843;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      _index_2 = *pvVar5;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_2._0_4_;
      puVar10[-1] = 0x164866;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      *pvVar5 = 0.0;
      if (1e-14 < ABS(_index_2)) {
        puVar10[-1] = 0x1648a8;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
        puVar10[-1] = 0x1648c4;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)puVar10[3],
                   (value_type_conflict1 *)puVar10[2]);
      }
      value_2._4_4_ = value_2._4_4_ + 1;
    }
    pvVar12 = &local_220->Uindex;
    puVar10[-1] = 0x1648f1;
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
    i_3 = (uint)sVar6;
    local_250[index + 1] = (uint)sVar6;
    local_258[index] =
         *(double *)(local_240 + (long)index * 8) * *(double *)(local_238 + (long)index * 8);
    puVar10[-1] = 0x164964;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)puVar10[-1]);
    for (value_3._4_4_ = 0; value_3._4_4_ < *(int *)(*(long *)(local_228 + (long)index * 8) + 0x84);
        value_3._4_4_ = value_3._4_4_ + 1) {
      lVar9 = *(long *)(local_228 + (long)index * 8);
      sVar6 = (size_type)value_3._4_4_;
      puVar10[-1] = 0x1649b7;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(lVar9 + 0x88),sVar6);
      value_3._0_4_ = *pvVar4;
      lVar9 = *(long *)(local_228 + (long)index * 8);
      sVar6 = (size_type)value_3._4_4_;
      puVar10[-1] = 0x1649e7;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar9 + 0xa0),sVar6);
      _pp_1 = *pvVar5;
      puVar10[-1] = 0x164a0a;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
      local_290 = _pp_1;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_3._0_4_;
      puVar10[-1] = 0x164a33;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      *pvVar5 = local_290;
    }
    for (pRow_1 = 0; pRow_1 < index; pRow_1 = pRow_1 + 1) {
      sVar6 = (size_type)pRow_1;
      puVar10[-1] = 0x164a82;
      pvVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&i_1
                          ,sVar6);
      local_128 = pvVar7->second;
      multiplier._4_4_ = iRow[local_128];
      local_298 = -*(double *)(local_240 + (long)local_128 * 8);
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)multiplier._4_4_;
      puVar10[-1] = 0x164aeb;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      _index_3 = local_298 * *pvVar5;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)multiplier._4_4_;
      puVar10[-1] = 0x164b16;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      if (1e-14 < ABS(*pvVar5)) {
        for (value_4._4_4_ = 0;
            value_4._4_4_ < *(int *)(*(long *)(local_228 + (long)local_128 * 8) + 0x84);
            value_4._4_4_ = value_4._4_4_ + 1) {
          lVar9 = *(long *)(local_228 + (long)local_128 * 8);
          sVar6 = (size_type)value_4._4_4_;
          puVar10[-1] = 0x164b8a;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(lVar9 + 0x88),sVar6);
          value_4._0_4_ = *pvVar4;
          lVar9 = *(long *)(local_228 + (long)local_128 * 8);
          sVar6 = (size_type)value_4._4_4_;
          puVar10[-1] = 0x164bba;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar9 + 0xa0),sVar6);
          _kpivot = *pvVar5;
          puVar10[-1] = 0x164bdd;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
          local_2a8 = _kpivot;
          local_2a0 = _index_3;
          pvVar13 = &local_220->dwork;
          sVar6 = (size_type)value_4._0_4_;
          puVar10[-1] = 0x164c16;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
          *pvVar5 = local_2a8 * local_2a0 + *pvVar5;
        }
      }
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)multiplier._4_4_;
      puVar10[-1] = 0x164c63;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      *pvVar5 = 0.0;
    }
    for (value_5._4_4_ = 0; value_5._4_4_ < index; value_5._4_4_ = value_5._4_4_ + 1) {
      value_5._0_4_ = iRow[value_5._4_4_];
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_5._0_4_;
      puVar10[-1] = 0x164cc5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      vStack_158 = *pvVar5;
      for (thex._4_4_ = local_250[value_5._4_4_]; thex._4_4_ < (int)local_250[value_5._4_4_ + 1];
          thex._4_4_ = thex._4_4_ + 1) {
        local_2b8 = &local_220->dwork;
        pvVar12 = &local_220->Uindex;
        sVar6 = (size_type)thex._4_4_;
        puVar10[-1] = 0x164d35;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar6);
        pvVar13 = local_2b8;
        iVar2 = *pvVar4;
        puVar10[-1] = 0x164d44;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,(long)iVar2);
        local_2b0 = *pvVar5;
        pvVar13 = &local_220->Uvalue;
        sVar6 = (size_type)thex._4_4_;
        puVar10[-1] = 0x164d6a;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
        vStack_158 = -local_2b0 * *pvVar5 + vStack_158;
      }
      vStack_158 = vStack_158 / (double)local_258[value_5._4_4_];
      puVar10[-1] = 0x164df7;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
      local_2c0 = vStack_158;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_5._0_4_;
      puVar10[-1] = 0x164e20;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      *pvVar5 = local_2c0;
    }
    _index_4 = 0.0;
    for (value_6._4_4_ = index_1; value_6._4_4_ < (int)i_3; value_6._4_4_ = value_6._4_4_ + 1) {
      pvVar12 = &local_220->Uindex;
      sVar6 = (size_type)value_6._4_4_;
      puVar10[-1] = 0x164e83;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar6);
      value_6._0_4_ = *pvVar4;
      pvVar13 = &local_220->Uvalue;
      sVar6 = (size_type)value_6._4_4_;
      puVar10[-1] = 0x164ea5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      pivotX = *pvVar5;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_6._0_4_;
      puVar10[-1] = 0x164ec8;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      _index_4 = *pvVar5 * pivotX + _index_4;
    }
    local_258[index] = _index_4 * *(double *)(local_240 + (long)index * 8) + _UstartX;
    pvVar13 = &local_220->dwork;
    iVar2 = iRow[index];
    puVar10[-1] = 0x164f5d;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,(long)iVar2);
    *pvVar5 = 0.0;
    _index_5 = -*(double *)(local_240 + (long)index * 8);
    value_7._4_4_ = 0;
    while( true ) {
      local_2c8 = (ulong)value_7._4_4_;
      pvVar12 = &local_220->iwork;
      puVar10[-1] = 0x164fc0;
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
      if (sVar6 <= local_2c8) break;
      pvVar12 = &local_220->iwork;
      uVar11 = (ulong)value_7._4_4_;
      puVar10[-1] = 0x164feb;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,uVar11);
      value_7._0_4_ = *pvVar4;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_7._0_4_;
      puVar10[-1] = 0x16500a;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      local_190 = *pvVar5;
      pvVar13 = &local_220->dwork;
      sVar6 = (size_type)value_7._0_4_;
      puVar10[-1] = 0x16502d;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar6);
      *pvVar5 = 0.0;
      if (1e-14 < ABS(local_190)) {
        puVar10[-1] = 0x16506f;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
        local_198 = local_190 * _index_5;
        puVar10[-1] = 0x1650a7;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)puVar10[1],
                   (value_type_conflict1 *)*puVar10);
      }
      value_7._4_4_ = value_7._4_4_ + 1;
    }
    puVar10[-1] = 0x1650e3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
    pvVar12 = &local_220->PFindex;
    local_2d8 = pvVar12;
    puVar10[-1] = 0x1650ff;
    local_2e8 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
    local_2d0 = &local_220->PFstart;
    puVar10[-1] = 0x165120;
    pvVar4 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)puVar10[1]);
    pvVar12 = local_2d8;
    local_220->FtotalX = ((int)local_2e8 - *pvVar4) + 1 + local_220->FtotalX;
    puVar10[-1] = 0x165151;
    local_2e0 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
    puVar10[-1] = 0x165164;
    pvVar4 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)puVar10[1]);
    pvVar12 = local_2d8;
    local_220->UtotalX = local_220->UtotalX + ((int)local_2e0 - *pvVar4);
    puVar10[-1] = 0x165193;
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
    local_19c = (int)sVar6;
    puVar10[-1] = 0x1651ac;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[1],(value_type *)*puVar10);
    puVar10[-1] = 0x1651cc;
    local_2f0 = std::make_pair<int&,int&>((int *)*puVar10,(int *)puVar10[-1]);
    local_1a4 = local_2f0;
    puVar10[-1] = 0x1651f6;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)puVar10[1],
               (value_type *)*puVar10);
    local_2f8 = &i_1;
    puVar10[-1] = 0x16520b;
    local_1b0 = (pair<int,_int> *)
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           *puVar10);
    puVar10[-1] = 0x16521e;
    _cIndex = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         *puVar10);
    puVar10[-1] = 0x165238;
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((pair<int,_int> *)puVar10[3],(pair<int,_int> *)puVar10[2]);
  }
  cLogic = 0;
  do {
    if ((int)vec._4_4_ <= cLogic) {
      puVar10[-1] = 0x165dbd;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)puVar10[3]);
      return;
    }
    k_2 = iRow[cLogic];
    iLogic_1 = *(int *)(local_248 + (long)cLogic * 4);
    pvVar12 = &local_220->URlastp;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x1652ae;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_300 = *pvVar4;
    pvVar12 = &local_220->URstart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x1652d0;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_220->FtotalX = local_220->FtotalX - (local_300 - *pvVar4);
    pvVar12 = &local_220->URlastp;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x1652fa;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_2fc = *pvVar4;
    pvVar12 = &local_220->URstart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x16531c;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_220->UtotalX = local_220->UtotalX - (local_2fc - *pvVar4);
    pvVar12 = &local_220->URstart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x16534c;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    iFind = *pvVar4;
    while( true ) {
      local_304 = iFind;
      pvVar12 = &local_220->URlastp;
      sVar3 = (size_type)iLogic_1;
      puVar10[-1] = 0x16537a;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      if (*pvVar4 <= local_304) break;
      local_310 = &local_220->UpivotLookup;
      pvVar12 = &local_220->URindex;
      sVar3 = (size_type)iFind;
      puVar10[-1] = 0x1653b5;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      pvVar12 = local_310;
      iVar2 = *pvVar4;
      puVar10[-1] = 0x1653c4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,(long)iVar2);
      iLast = *pvVar4;
      pvVar12 = &local_220->Ustart;
      sVar3 = (size_type)iLast;
      puVar10[-1] = 0x1653e6;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      k_3 = *pvVar4;
      pvVar12 = &local_220->Ulastp;
      sVar3 = (size_type)iLast;
      puVar10[-1] = 0x165408;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      iLogic_2 = *pvVar4 + -1;
      *pvVar4 = iLogic_2;
      for (; k_3 <= iLogic_2; k_3 = k_3 + 1) {
        pvVar12 = &local_220->Uindex;
        sVar3 = (size_type)k_3;
        puVar10[-1] = 0x165440;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        if (*pvVar4 == k_2) break;
      }
      pvVar12 = &local_220->Uindex;
      sVar3 = (size_type)iLogic_2;
      puVar10[-1] = 0x165479;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      local_31c = *pvVar4;
      pvVar12 = &local_220->Uindex;
      sVar3 = (size_type)k_3;
      puVar10[-1] = 0x16549b;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      *pvVar4 = local_31c;
      pvVar13 = &local_220->Uvalue;
      sVar3 = (size_type)iLogic_2;
      puVar10[-1] = 0x1654bd;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
      local_318 = *pvVar5;
      pvVar13 = &local_220->Uvalue;
      sVar3 = (size_type)k_3;
      puVar10[-1] = 0x1654e3;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
      *pvVar5 = local_318;
      iFind = iFind + 1;
    }
    pvVar12 = &local_220->Ulastp;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x16551d;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_324 = *pvVar4;
    pvVar12 = &local_220->Ustart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x16553f;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_220->FtotalX = local_220->FtotalX - (local_324 - *pvVar4);
    pvVar12 = &local_220->Ulastp;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x165569;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_320 = *pvVar4;
    pvVar12 = &local_220->Ustart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x16558b;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_220->UtotalX = local_220->UtotalX - (local_320 - *pvVar4);
    pvVar12 = &local_220->Ustart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x1655bb;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    iFind_1 = *pvVar4;
    while( true ) {
      local_328 = iFind_1;
      pvVar12 = &local_220->Ulastp;
      sVar3 = (size_type)iLogic_1;
      puVar10[-1] = 0x1655e9;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      if (*pvVar4 <= local_328) break;
      local_330 = &local_220->UpivotLookup;
      pvVar12 = &local_220->Uindex;
      sVar3 = (size_type)iFind_1;
      puVar10[-1] = 0x165624;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      pvVar12 = local_330;
      iVar2 = *pvVar4;
      puVar10[-1] = 0x165633;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,(long)iVar2);
      iLast_1 = *pvVar4;
      pvVar12 = &local_220->URstart;
      sVar3 = (size_type)iLast_1;
      puVar10[-1] = 0x165655;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      UstartX_1 = *pvVar4;
      pvVar12 = &local_220->URlastp;
      sVar3 = (size_type)iLast_1;
      puVar10[-1] = 0x165677;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      UendX = *pvVar4 + -1;
      *pvVar4 = UendX;
      for (; UstartX_1 <= UendX; UstartX_1 = UstartX_1 + 1) {
        pvVar12 = &local_220->URindex;
        sVar3 = (size_type)UstartX_1;
        puVar10[-1] = 0x1656af;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        if (*pvVar4 == k_2) break;
      }
      pvVar12 = &local_220->URspace;
      sVar3 = (size_type)iLast_1;
      puVar10[-1] = 0x1656e8;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      *pvVar4 = *pvVar4 + 1;
      pvVar12 = &local_220->URindex;
      sVar3 = (size_type)UendX;
      puVar10[-1] = 0x165709;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      local_33c = *pvVar4;
      pvVar12 = &local_220->URindex;
      sVar3 = (size_type)UstartX_1;
      puVar10[-1] = 0x16572b;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      *pvVar4 = local_33c;
      pvVar13 = &local_220->URvalue;
      sVar3 = (size_type)UendX;
      puVar10[-1] = 0x16574d;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
      local_338 = *pvVar5;
      pvVar13 = &local_220->URvalue;
      sVar3 = (size_type)UstartX_1;
      puVar10[-1] = 0x165773;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
      *pvVar5 = local_338;
      iFind_1 = iFind_1 + 1;
    }
    k_4 = local_250[cLogic];
    iLogic_3 = local_250[cLogic + 1];
    local_220->FtotalX = (iLogic_3 - k_4) + 1 + local_220->FtotalX;
    local_220->UtotalX = (iLogic_3 - k_4) + local_220->UtotalX;
    for (row_start = k_4; row_start < iLogic_3; row_start = row_start + 1) {
      local_348 = &local_220->UpivotLookup;
      pvVar12 = &local_220->Uindex;
      sVar3 = (size_type)row_start;
      puVar10[-1] = 0x16583b;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      pvVar12 = local_348;
      iVar2 = *pvVar4;
      puVar10[-1] = 0x16584a;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,(long)iVar2);
      row_count = *pvVar4;
      pvVar12 = &local_220->URspace;
      sVar3 = (size_type)row_count;
      puVar10[-1] = 0x16586c;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      if (*pvVar4 == 0) {
        pvVar12 = &local_220->URstart;
        sVar3 = (size_type)row_count;
        puVar10[-1] = 0x16588f;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        new_start = *pvVar4;
        pvVar12 = &local_220->URlastp;
        sVar3 = (size_type)row_count;
        puVar10[-1] = 0x1658b1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        new_space = *pvVar4 - new_start;
        pvVar12 = &local_220->URindex;
        local_350 = pvVar12;
        puVar10[-1] = 0x1658db;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
        iFrom = (int)sVar3;
        iEnd = (int)((double)new_space * 1.1 + 5.0);
        puVar10[-1] = 0x165928;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)puVar10[5],puVar10[4]);
        puVar10[-1] = 0x16594e;
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)puVar10[5],puVar10[4]);
        iTo = new_start;
        iPut = new_start + new_space;
        local_210 = iFrom;
        pvVar12 = &local_220->URindex;
        sVar3 = (size_type)new_start;
        local_368 = pvVar12;
        puVar10[-1] = 0x16599d;
        local_360 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        pvVar12 = local_368;
        sVar3 = (size_type)iPut;
        puVar10[-1] = 0x1659b7;
        local_358 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        pvVar12 = local_368;
        sVar3 = (size_type)local_210;
        puVar10[-1] = 0x1659d1;
        std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        puVar10[-1] = 0x1659e7;
        std::copy<int*,int*>((int *)puVar10[3],(int *)puVar10[2],(int *)puVar10[1]);
        pvVar13 = &local_220->URvalue;
        sVar3 = (size_type)iTo;
        local_380 = pvVar13;
        puVar10[-1] = 0x165a0a;
        local_378 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
        pvVar13 = local_380;
        sVar3 = (size_type)iPut;
        puVar10[-1] = 0x165a24;
        local_370 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
        pvVar13 = local_380;
        sVar3 = (size_type)local_210;
        puVar10[-1] = 0x165a3e;
        std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
        puVar10[-1] = 0x165a54;
        std::copy<double*,double*>((double *)puVar10[3],(double *)puVar10[2],(double *)puVar10[1]);
        local_38c = iFrom;
        pvVar12 = &local_220->URstart;
        sVar3 = (size_type)row_count;
        puVar10[-1] = 0x165a7c;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        *pvVar4 = local_38c;
        local_388 = iFrom + new_space;
        pvVar12 = &local_220->URlastp;
        sVar3 = (size_type)row_count;
        puVar10[-1] = 0x165ab0;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        *pvVar4 = local_388;
        local_384 = iEnd - new_space;
        pvVar12 = &local_220->URspace;
        sVar3 = (size_type)row_count;
        puVar10[-1] = 0x165ae4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
        *pvVar4 = local_384;
      }
      pvVar12 = &local_220->URspace;
      sVar3 = (size_type)row_count;
      puVar10[-1] = 0x165b06;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      *pvVar4 = *pvVar4 + -1;
      pvVar12 = &local_220->URlastp;
      sVar3 = (size_type)row_count;
      puVar10[-1] = 0x165b27;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      local_214 = *pvVar4;
      *pvVar4 = local_214 + 1;
      local_39c = k_2;
      pvVar12 = &local_220->URindex;
      sVar3 = (size_type)local_214;
      puVar10[-1] = 0x165b5f;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
      *pvVar4 = local_39c;
      pvVar13 = &local_220->Uvalue;
      sVar3 = (size_type)row_start;
      puVar10[-1] = 0x165b81;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
      local_398 = *pvVar5;
      pvVar13 = &local_220->URvalue;
      sVar3 = (size_type)local_214;
      puVar10[-1] = 0x165ba7;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar13,sVar3);
      *pvVar5 = local_398;
    }
    puVar10[-1] = 0x165be1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
    puVar10[-1] = 0x165bfd;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
    pvVar12 = &local_220->URstart;
    sVar3 = (size_type)iLogic_1;
    local_3b0[1] = pvVar12;
    puVar10[-1] = 0x165c20;
    std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    puVar10[-1] = 0x165c2f;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
    local_3b0[0] = &local_220->URlastp;
    pvVar12 = &local_220->URstart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x165c5b;
    std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    puVar10[-1] = 0x165c6a;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
    pvVar12 = &local_220->URspace;
    sVar3 = (size_type)iLogic_1;
    local_3c0 = pvVar12;
    puVar10[-1] = 0x165c8d;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_3c4 = *pvVar4;
    pvVar12 = &local_220->URlastp;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x165caf;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    uStack_3b8._4_4_ = local_3c4 + *pvVar4;
    pvVar12 = &local_220->URstart;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x165cdc;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    local_218 = uStack_3b8._4_4_ - *pvVar4;
    puVar10[-1] = 0x165d02;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[1],(value_type *)*puVar10);
    pvVar12 = &local_220->UpivotIndex;
    local_3d0 = pvVar12;
    puVar10[-1] = 0x165d1e;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar12);
    uStack_3d8._4_4_ = (value_type)sVar3;
    pvVar12 = &local_220->UpivotLookup;
    sVar3 = (size_type)k_2;
    puVar10[-1] = 0x165d3e;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    pvVar12 = local_3d0;
    *pvVar4 = uStack_3d8._4_4_;
    sVar3 = (size_type)iLogic_1;
    puVar10[-1] = 0x165d59;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,sVar3);
    *pvVar4 = -1;
    puVar10[-1] = 0x165d72;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)puVar10[3],(value_type *)puVar10[2]);
    puVar10[-1] = 0x165d99;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)puVar10[3],
               (value_type_conflict1 *)puVar10[2]);
    cLogic = cLogic + 1;
  } while( true );
}

Assistant:

void HFactor::updateCFT(HVector *aq, HVector *ep, int *iRow, int *hint) {

    /*
     * In the major update loop, the prefix
     *
     * c(p) = current working pivot
     * p(p) = previous pivot  (0 =< pp < cp)
     */

    int numUpdate = 0;
    for (HVector *vec = aq; vec != 0; vec = vec->next)
        numUpdate++;

    HVector* aqWork[numUpdate];
    HVector* epWork[numUpdate];

    for (int i = 0; i < numUpdate; i++) {
        aqWork[i] = aq;
        epWork[i] = ep;
        aq = aq->next;
        ep = ep->next;
    }

    // Pivot related buffers
    int PFnp0 = PFpivotIndex.size();
    int pLogic[numUpdate];
    double pValue[numUpdate];
    double pAlpha[numUpdate];
    for (int cp = 0; cp < numUpdate; cp++) {
        int cRow = iRow[cp];
        int iLogic = UpivotLookup[cRow];
        pLogic[cp] = iLogic;
        pValue[cp] = UpivotValue[iLogic];
        pAlpha[cp] = aqWork[cp]->array[cRow];
    }

    // Temporary U pointers
    int Tstart[numUpdate + 1];
    double Tpivot[numUpdate];
    Tstart[0] = Uindex.size();

    // Logically sorted previous row_ep
    vector<pair<int, int> > sorted_pp;

    // Major update loop
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Expand partial FTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < aqWork[cp]->packCount; i++) {
            int index = aqWork[cp]->packIndex[i];
            double value = aqWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 2. Update partial FTRAN result by recent FT matrix
        for (int pp = 0; pp < cp; pp++) {
            int pRow = iRow[pp];
            double value = dwork[pRow];
            int PFpp = pp + PFnp0;
            for (int i = PFstart[PFpp]; i < PFstart[PFpp + 1]; i++)
                value -= dwork[PFindex[i]] * PFvalue[i];
            iwork.push_back(pRow); // OK to duplicate
            dwork[pRow] = value;
        }

        // 3. Store the partial FTRAN result to matirx U
        double ppaq = dwork[iRow[cp]]; // pivot of the partial aq
        dwork[iRow[cp]] = 0;
        int UcountX = Tstart[cp];
        int UstartX = UcountX;
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0; // This effectively removes all duplication
            if (fabs(value) > HSOL_CONST_TINY) {
                Uindex.push_back(index);
                Uvalue.push_back(value);
            }
        }
        UcountX = Uindex.size();
        Tstart[cp + 1] = UcountX;
        Tpivot[cp] = pValue[cp] * pAlpha[cp];

        // 4. Expand partial BTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < epWork[cp]->packCount; i++) {
            int index = epWork[cp]->packIndex[i];
            double value = epWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 5. Delete logical later rows (in logical order)
        for (int isort = 0; isort < cp; isort++) {
            int pp = sorted_pp[isort].second;
            int pRow = iRow[pp];
            double multiplier = -pValue[pp] * dwork[pRow];
            if (fabs(dwork[pRow]) > HSOL_CONST_TINY) {
                for (int i = 0; i < epWork[pp]->packCount; i++) {
                    int index = epWork[pp]->packIndex[i];
                    double value = epWork[pp]->packValue[i];
                    iwork.push_back(index);
                    dwork[index] += value * multiplier;
                }
            }
            dwork[pRow] = 0; // Force to be 0
        }

        // 6. Update partial BTRAN result by recent U columns
        for (int pp = 0; pp < cp; pp++) {
            int kpivot = iRow[pp];
            double value = dwork[kpivot];
            for (int k = Tstart[pp]; k < Tstart[pp + 1]; k++)
                value -= dwork[Uindex[k]] * Uvalue[k];
            value /= Tpivot[pp];
            iwork.push_back(kpivot);
            dwork[kpivot] = value; // Again OK to duplicate
        }

        // 6.x compute current alpha
        double thex = 0;
        for (int k = UstartX; k < UcountX; k++) {
            int index = Uindex[k];
            double value = Uvalue[k];
            thex += dwork[index] * value;
        }
        Tpivot[cp] = ppaq + thex * pValue[cp];

        // 7. Store BTRAN result to FT elimination, update logic helper
        dwork[iRow[cp]] = 0;
        double pivotX = -pValue[cp];
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0;
            if (fabs(value) > HSOL_CONST_TINY) {
                PFindex.push_back(index);
                PFvalue.push_back(value * pivotX);
            }
        }
        PFpivotIndex.push_back(iRow[cp]);
        FtotalX += PFindex.size() - PFstart.back() + 1;
        UtotalX += PFindex.size() - PFstart.back();
        PFstart.push_back(PFindex.size());

        // 8. Update the sorted ep
        sorted_pp.push_back(make_pair(pLogic[cp], cp));
        sort(sorted_pp.begin(), sorted_pp.end());
    }

    // Now modify the U matrix
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Delete pivotal row from U
        int cIndex = iRow[cp];
        int cLogic = pLogic[cp];
        FtotalX -= URlastp[cLogic] - URstart[cLogic];
        UtotalX -= URlastp[cLogic] - URstart[cLogic];
        for (int k = URstart[cLogic]; k < URlastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[URindex[k]];
            int iFind = Ustart[iLogic];
            int iLast = --Ulastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (Uindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            Uindex[iFind] = Uindex[iLast];
            Uvalue[iFind] = Uvalue[iLast];
        }

        // 2. Delete pivotal column from UR
        FtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        UtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        for (int k = Ustart[cLogic]; k < Ulastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[Uindex[k]];
            int iFind = URstart[iLogic];
            int iLast = --URlastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (URindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            URspace[iLogic]++;
            URindex[iFind] = URindex[iLast];
            URvalue[iFind] = URvalue[iLast];
        }

        // 3. Insert the (stored) partial FTRAN to the row matrix
        int UstartX = Tstart[cp];
        int UendX = Tstart[cp + 1];
        FtotalX += UendX - UstartX + 1;
        UtotalX += UendX - UstartX;
        // Store column as UR elements
        for (int k = UstartX; k < UendX; k++) {
            // Which ETA file
            int iLogic = UpivotLookup[Uindex[k]];

            // Move row to the end if necessary
            if (URspace[iLogic] == 0) {
                // Make pointers
                int row_start = URstart[iLogic];
                int row_count = URlastp[iLogic] - row_start;
                int new_start = URindex.size();
                int new_space = row_count * 1.1 + 5;

                // Check matrix UR
                URindex.resize(new_start + new_space);
                URvalue.resize(new_start + new_space);

                // Move elements
                int iFrom = row_start;
                int iEnd = row_start + row_count;
                int iTo = new_start;
                copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
                copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

                // Save new pointers
                URstart[iLogic] = new_start;
                URlastp[iLogic] = new_start + row_count;
                URspace[iLogic] = new_space - row_count;
            }

            // Put into the next available space
            URspace[iLogic]--;
            int iPut = URlastp[iLogic]++;
            URindex[iPut] = cIndex;
            URvalue[iPut] = Uvalue[k];
        }

        // 4. Save pointers
        Ustart.push_back(UstartX);
        Ulastp.push_back(UendX);

        URstart.push_back(URstart[cLogic]);
        URlastp.push_back(URstart[cLogic]);
        URspace.push_back(URspace[cLogic] + URlastp[cLogic] - URstart[cLogic]);

        UpivotLookup[cIndex] = UpivotIndex.size();
        UpivotIndex[cLogic] = -1;
        UpivotIndex.push_back(cIndex);
        UpivotValue.push_back(Tpivot[cp]);
    }

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;

}